

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkDebugReportUtil.cpp
# Opt level: O0

char * vk::anon_unknown_0::getShortObjectTypeName(VkDebugReportObjectTypeEXT objectType)

{
  char **ppcVar1;
  VkDebugReportObjectTypeEXT objectType_local;
  
  ppcVar1 = de::getSizedArrayElement<29,29,char_const*>(&getShortObjectTypeName::s_names,objectType)
  ;
  return *ppcVar1;
}

Assistant:

const char* getShortObjectTypeName (VkDebugReportObjectTypeEXT objectType)
{
	static const char* const s_names[] =
	{
		"Unknown",
		"Instance",
		"PhysicalDevice",
		"Device",
		"Queue",
		"Semaphore",
		"CommandBuffer",
		"Fence",
		"DeviceMemory",
		"Buffer",
		"Image",
		"Event",
		"QueryPool",
		"BufferView",
		"ImageView",
		"ShaderModule",
		"PipelineCache",
		"PipelineLayout",
		"RenderPass",
		"Pipeline",
		"DescriptorSetLayout",
		"Sampler",
		"DescriptorPool",
		"DescriptorSet",
		"Framebuffer",
		"CommandPool",
		"SurfaceKHR",
		"SwapchainKHR",
		"DebugReportCallbackEXT",
	};
	return de::getSizedArrayElement<VK_DEBUG_REPORT_OBJECT_TYPE_EXT_LAST>(s_names, objectType);
}